

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# genericmodel.cpp
# Opt level: O2

void __thiscall
GenericModelItem::insertRows(GenericModelItem *this,int row,QVector<GenericModelItem_*> *rows)

{
  QVector<GenericModelItem_*> *this_00;
  int iVar1;
  uint uVar2;
  long lVar3;
  qsizetype qVar4;
  reference ppGVar5;
  iterator __first;
  iterator __last;
  iterator iVar6;
  int iVar7;
  ulong uVar8;
  long i;
  ulong i_00;
  
  lVar3 = (rows->d).size;
  iVar1 = this->m_colCount;
  this_00 = &this->children;
  qVar4 = (this->children).d.size;
  for (i = (long)(iVar1 * row); iVar7 = (int)(lVar3 / (long)iVar1), i < (int)qVar4; i = i + 1) {
    ppGVar5 = QList<GenericModelItem_*>::operator[](this_00,i);
    (*ppGVar5)->m_row = (*ppGVar5)->m_row + iVar7;
  }
  uVar2 = (uint)(rows->d).size;
  i_00 = 0;
  uVar8 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar8 = i_00;
  }
  for (; uVar8 != i_00; i_00 = i_00 + 1) {
    ppGVar5 = QList<GenericModelItem_*>::operator[](rows,i_00);
    (*ppGVar5)->parent = this;
    iVar1 = this->m_colCount;
    ppGVar5 = QList<GenericModelItem_*>::operator[](rows,i_00);
    (*ppGVar5)->m_row =
         (int)((long)((ulong)(uint)((int)i_00 >> 0x1f) << 0x20 | i_00 & 0xffffffff) / (long)iVar1) +
         row;
  }
  QList<GenericModelItem_*>::insert
            (this_00,(long)this->m_colCount * (long)row,(rows->d).size,(parameter_type)0x0);
  __first = QList<GenericModelItem_*>::begin(rows);
  __last = QList<GenericModelItem_*>::end(rows);
  iVar6 = QList<GenericModelItem_*>::begin(this_00);
  std::__copy_move<false,false,std::random_access_iterator_tag>::
  __copy_m<QList<GenericModelItem*>::iterator,QList<GenericModelItem*>::iterator>
            (__first,__last,(iterator)(iVar6.i + (long)this->m_colCount * (long)row));
  this->m_rowCount = this->m_rowCount + iVar7;
  return;
}

Assistant:

void GenericModelItem::insertRows(int row, QVector<GenericModelItem *> rows)
{
    Q_ASSERT(row >= 0 && row <= m_rowCount);
    Q_ASSERT(!rows.isEmpty());
    Q_ASSERT(rows.count() % m_colCount == 0);
    const int count = rows.count() / m_colCount;
    for (int i = row * m_colCount, maxI = children.size(); i < maxI; ++i)
        children[i]->m_row += count;
    for (int i = 0, maxI = rows.size(); i < maxI; ++i) {
        rows[i]->parent = this;
        rows[i]->m_row = row + (i / m_colCount);
    }
    children.insert(row * m_colCount, rows.size(), nullptr);
    std::copy(rows.begin(), rows.end(), children.begin() + (row * m_colCount));
    m_rowCount += count;
#ifdef QT_DEBUG
    Q_ASSERT(m_colCount * m_rowCount == children.size());
    Q_ASSERT(std::all_of(children.constBegin(), children.constEnd(), [](GenericModelItem *item) -> bool { return item != nullptr; }));
    for (int i = 0; i < children.size(); ++i) {
        Q_ASSERT(children.at(i)->row() == i / m_colCount);
        Q_ASSERT(children.at(i)->column() == i % m_colCount);
    }
#endif
}